

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

void run_repl(void)

{
  char *pcVar1;
  ssize_t sVar2;
  void *previous;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  char *line;
  Vm vm;
  char *local_2140;
  Vm local_2138;
  
  vm_init(&local_2138,true);
  printf(">>> ");
  sVar2 = read_line(&local_2140);
  if (-1 < sVar2) {
    previous = (void *)0x0;
    uVar4 = 0;
    uVar5 = 0;
    do {
      interpret_interactive(&local_2138,local_2140);
      pcVar1 = local_2140;
      if (uVar4 <= uVar5) {
        uVar3 = (ulong)(uVar4 * 2);
        if (uVar4 < 8) {
          uVar3 = 8;
        }
        previous = reallocate(previous,uVar3 * 8);
        uVar4 = (uint)uVar3;
      }
      uVar3 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      *(char **)((long)previous + uVar3 * 8) = pcVar1;
      printf(">>> ");
      sVar2 = read_line(&local_2140);
    } while (-1 < sVar2);
  }
  fwrite("Bye.\n",5,1,_stderr);
  exit(0);
}

Assistant:

void run_repl() {
    Vm vm;
    vm_init(&vm, true);

    LineArray lines;
    init_line_array(&lines);

    while (true) {
        repl(&vm, &lines);
    }
}